

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O3

vm_prop_id_t __thiscall CVmImageLoader::get_last_prop(CVmImageLoader *this)

{
  vm_val_t ele;
  vm_val_t vec;
  vm_val_t vStack_38;
  vm_val_t local_28;
  vm_val_t local_18;
  
  local_28.typ = VM_OBJ;
  local_28.val.obj = G_predef_X.last_prop_obj;
  local_18.typ = VM_INT;
  local_18.val.obj = 1;
  vm_val_t::ll_index(&local_28,&vStack_38,&local_18);
  return vStack_38.val.prop;
}

Assistant:

vm_prop_id_t CVmImageLoader::get_last_prop(VMG0_)
{
    /* get LastPropObj[1] */
    vm_val_t vec, ele;
    vec.set_obj(G_predef->last_prop_obj);
    vec.ll_index(vmg_ &ele, 1);

    /* return the value */
    return ele.val.prop;
}